

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QString * __thiscall
QFileSystemModelPrivate::displayName(QFileSystemModelPrivate *this,QModelIndex *index)

{
  QModelIndex *in_RDI;
  QFileSystemModelPrivate *unaff_retaddr;
  
  name(unaff_retaddr,in_RDI);
  return (QString *)in_RDI;
}

Assistant:

QString QFileSystemModelPrivate::displayName(const QModelIndex &index) const
{
#if defined(Q_OS_WIN)
    QFileSystemNode *dirNode = node(index);
    if (!dirNode->volumeName.isEmpty())
        return dirNode->volumeName;
#endif
    return name(index);
}